

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXImporter.cpp
# Opt level: O3

void __thiscall Assimp::FBXImporter::FBXImporter(FBXImporter *this)

{
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00936b50;
  (this->settings).strictMode = true;
  (this->settings).readAllLayers = true;
  (this->settings).readAllMaterials = false;
  (this->settings).readMaterials = true;
  (this->settings).readTextures = true;
  (this->settings).readCameras = true;
  (this->settings).readLights = true;
  (this->settings).readAnimations = true;
  (this->settings).readWeights = true;
  (this->settings).preservePivots = true;
  (this->settings).optimizeEmptyAnimationCurves = true;
  (this->settings).useLegacyEmbeddedTextureNaming = false;
  (this->settings).removeEmptyBones = true;
  (this->settings).convertToMeters = false;
  return;
}

Assistant:

FBXImporter::FBXImporter()
{
}